

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O1

void __thiscall Memory::HeapInfo::TransferDisposedObjects(HeapInfo *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  long lVar5;
  
  if (this->hasPendingTransferDisposedObjects == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x618,"(this->hasPendingTransferDisposedObjects)",
                       "this->hasPendingTransferDisposedObjects");
    if (!bVar2) goto LAB_006eb920;
    *puVar4 = 0;
  }
  BVar3 = Recycler::IsConcurrentExecutingState(this->recycler);
  if (BVar3 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x61d,"(!this->recycler->IsConcurrentExecutingState())",
                       "!this->recycler->IsConcurrentExecutingState()");
    if (!bVar2) {
LAB_006eb920:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  this->hasPendingTransferDisposedObjects = false;
  lVar5 = 0x78;
  do {
    HeapBucketGroup<SmallAllocationBlockAttributes>::TransferDisposedObjects
              ((HeapBucketGroup<SmallAllocationBlockAttributes> *)
               ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler +
               lVar5));
    lVar5 = lVar5 + 0x380;
  } while (lVar5 != 0xa878);
  lVar5 = 0;
  do {
    HeapBucketGroup<MediumAllocationBlockAttributes>::TransferDisposedObjects
              ((HeapBucketGroup<MediumAllocationBlockAttributes> *)
               ((long)&this->mediumHeapBuckets[0].heapBucket.
                       super_SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                       .
                       super_HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                       .super_HeapBucket.heapInfo + lVar5));
    lVar5 = lVar5 + 0x380;
  } while (lVar5 != 0x6580);
  LargeHeapBucket::TransferDisposedObjects(&this->largeObjectBucket);
  return;
}

Assistant:

void
HeapInfo::TransferDisposedObjects()
{
    Assert(this->hasPendingTransferDisposedObjects);
#if ENABLE_CONCURRENT_GC
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP 
    Assert(!this->recycler->IsConcurrentExecutingState() && !this->recycler->IsConcurrentSweepState());
#else
    Assert(!this->recycler->IsConcurrentExecutingState());
#endif
#endif
    this->hasPendingTransferDisposedObjects = false;

    // move the disposed object back to the free lists
    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        heapBuckets[i].TransferDisposedObjects();
    }

#ifdef BUCKETIZE_MEDIUM_ALLOCATIONS
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        mediumHeapBuckets[i].TransferDisposedObjects();
    }
#endif

    largeObjectBucket.TransferDisposedObjects();
}